

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void GC::MarkPendingRoots(void)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  
  if ((next != (long *)0x0) && (*(int *)((long)next + 0xc) != 0)) {
    while (plVar4 = next, plVar3 = curr, uVar1 = *(uint *)((long)next + 0xc), uVar1 != 0) {
      curr = next;
      next = plVar3;
      lVar2 = *plVar4;
      lVar5 = 0;
      do {
        CheckBasePointer(*(char **)(lVar2 + lVar5));
        lVar5 = lVar5 + 8;
      } while ((ulong)uVar1 << 3 != lVar5);
      *(undefined4 *)((long)curr + 0xc) = 0;
    }
  }
  return;
}

Assistant:

void GC::MarkPendingRoots()
{
	if(!GC::next)
		return;

	if(GC::next->empty())
		return;

	while(GC::next->size())
	{
		GC_DEBUG_PRINT("Checking new roots\n");

		FastVector<char*> *tmp = GC::curr;
		GC::curr = GC::next;
		GC::next = tmp;

		for(char **c = GC::curr->data, **e = GC::curr->data + GC::curr->size(); c != e; c++)
		{
			GC_DEBUG_PRINT("\tRoot pointer base is %p\n", *c);

			GC::CheckBasePointer(*c);
		}

		GC::curr->clear();
	}

	GC_DEBUG_PRINT("\n");
}